

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeHeapPull(u32 *aHeap,u32 *pOut)

{
  uint uVar1;
  u32 uVar2;
  uint local_28;
  u32 x;
  u32 i;
  u32 j;
  u32 *pOut_local;
  u32 *aHeap_local;
  
  uVar1 = *aHeap;
  if (uVar1 == 0) {
    aHeap_local._4_4_ = 0;
  }
  else {
    *pOut = aHeap[1];
    aHeap[1] = aHeap[uVar1];
    aHeap[uVar1] = 0xffffffff;
    *aHeap = *aHeap - 1;
    local_28 = 1;
    while (x = local_28 * 2, x <= *aHeap) {
      if (aHeap[x + 1] < aHeap[x]) {
        x = x + 1;
      }
      if (aHeap[local_28] < aHeap[x]) break;
      uVar2 = aHeap[local_28];
      aHeap[local_28] = aHeap[x];
      aHeap[x] = uVar2;
      local_28 = x;
    }
    aHeap_local._4_4_ = 1;
  }
  return aHeap_local._4_4_;
}

Assistant:

static int btreeHeapPull(u32 *aHeap, u32 *pOut){
  u32 j, i, x;
  if( (x = aHeap[0])==0 ) return 0;
  *pOut = aHeap[1];
  aHeap[1] = aHeap[x];
  aHeap[x] = 0xffffffff;
  aHeap[0]--;
  i = 1;
  while( (j = i*2)<=aHeap[0] ){
    if( aHeap[j]>aHeap[j+1] ) j++;
    if( aHeap[i]<aHeap[j] ) break;
    x = aHeap[i];
    aHeap[i] = aHeap[j];
    aHeap[j] = x;
    i = j;
  }
  return 1;  
}